

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseAudio_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *psVar1;
  allocator local_59;
  string local_58;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::Audio,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_58);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"file_id",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Audio,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  fileId);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"duration",(allocator *)&local_38);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,
                      &((object->super___shared_ptr<TgBot::Audio,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->duration);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"mime_type",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Audio,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  mimeType);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"file_size",(allocator *)&local_38);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,
                      &((object->super___shared_ptr<TgBot::Audio,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->fileSize);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"thumb",&local_59);
    psVar1 = &local_38;
    parsePhotoSize_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Audio,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                thumb);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseAudio(const Audio::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "file_id", object->fileId);
    appendToJson(result, "duration", object->duration);
    appendToJson(result, "mime_type", object->mimeType);
    appendToJson(result, "file_size", object->fileSize);
    appendToJson(result, "thumb", parsePhotoSize(object->thumb));
    removeLastComma(result);
    result += '}';
    return result;
}